

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

ssize_t http_decode_url_unsafe(char *dest,char *url_data)

{
  int iVar1;
  uint8_t *local_28;
  char *pos;
  char *url_data_local;
  char *dest_local;
  
  local_28 = (uint8_t *)dest;
  pos = url_data;
  do {
    if (*pos == '\0') {
      *local_28 = '\0';
      return (ssize_t)(local_28 + -(long)dest);
    }
    if (*pos == '+') {
      *local_28 = ' ';
      pos = pos + 1;
    }
    else if (*pos == '%') {
      iVar1 = hex2byte(local_28,(uint8_t *)(pos + 1));
      if (iVar1 != 0) {
        return -1;
      }
      pos = pos + 3;
    }
    else {
      *local_28 = *pos;
      pos = pos + 1;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

ssize_t http_decode_url_unsafe(char *dest, const char *url_data) {
  char *pos = dest;
  while (*url_data) {
    if (*url_data == '+') {
      // decode space
      *(pos++) = ' ';
      ++url_data;
    } else if (*url_data == '%') {
      // decode hex value
      // this is a percent encoded value.
      if (hex2byte((uint8_t *)pos, (uint8_t *)&url_data[1]))
        return -1;
      pos++;
      url_data += 3;
    } else
      *(pos++) = *(url_data++);
  }
  *pos = 0;
  return pos - dest;
}